

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O3

void gdImageGifCtx(gdImagePtr im,gdIOCtxPtr out)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uchar c;
  uchar c_00;
  byte bVar6;
  gdImagePtr im_00;
  uint uVar7;
  long lVar8;
  char *buf;
  uint uVar9;
  GifCtx local_c510;
  
  iVar1 = im->interlace;
  if (im->trueColor == 0) {
    im_00 = (gdImagePtr)0x0;
  }
  else {
    im_00 = gdImageCreatePaletteFromTrueColor(im,1,0x100);
    im = im_00;
    if (im_00 == (gdImagePtr)0x0) {
      return;
    }
  }
  uVar7 = im->colorsTotal;
  uVar9 = 1;
  if ((((2 < (int)uVar7) && (uVar9 = 2, 4 < uVar7)) && (uVar9 = 3, 8 < uVar7)) &&
     (((uVar9 = 4, 0x10 < uVar7 && (uVar9 = 5, 0x20 < uVar7)) &&
      ((uVar9 = 6, 0x40 < uVar7 && (uVar9 = 7, 0x80 < uVar7)))))) {
    uVar9 = (uint)(uVar7 < 0x101) << 3;
  }
  iVar2 = im->sx;
  iVar3 = im->sy;
  iVar4 = im->transparent;
  memset(&local_c510.n_bits,0,0xc4c0);
  local_c510.in_count = 1;
  local_c510.CountDown = (long)iVar3 * (long)iVar2;
  local_c510.Pass = 0;
  local_c510.curx = 0;
  local_c510.cury = 0;
  buf = "GIF89a";
  if (iVar4 < 0) {
    buf = "GIF87a";
  }
  local_c510.Width = iVar2;
  local_c510.Height = iVar3;
  local_c510.Interlace = iVar1;
  gdPutBuf(buf,6,out);
  gdPutC((uchar)iVar2,out);
  c = (uchar)((uint)iVar2 >> 8);
  gdPutC(c,out);
  gdPutC((uchar)iVar3,out);
  c_00 = (uchar)((uint)iVar3 >> 8);
  gdPutC(c_00,out);
  bVar6 = (sbyte)uVar9 - 1;
  gdPutC(bVar6 * '\x10' | bVar6 | 0x80,out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  lVar8 = 0x205;
  do {
    gdPutC(*(uchar *)((long)im + lVar8 * 4 + -0x800),out);
    gdPutC(*(uchar *)((long)im + lVar8 * 4 + -0x400),out);
    gdPutC((uchar)im->red[lVar8 + -5],out);
    iVar5 = (int)lVar8;
    lVar8 = lVar8 + 1;
  } while (iVar5 - 0x204U >> (sbyte)uVar9 == 0);
  if (-1 < iVar4) {
    gdPutC('!',out);
    gdPutC(0xf9,out);
    gdPutC('\x04',out);
    gdPutC('\x01',out);
    gdPutC('\0',out);
    gdPutC('\0',out);
    gdPutC((uchar)iVar4,out);
    gdPutC('\0',out);
  }
  gdPutC(',',out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  gdPutC((uchar)iVar2,out);
  gdPutC(c,out);
  gdPutC((uchar)iVar3,out);
  gdPutC(c_00,out);
  gdPutC((iVar1 != 0) << 6,out);
  uVar7 = 2;
  if (2 < uVar9) {
    uVar7 = uVar9;
  }
  gdPutC((uchar)uVar7,out);
  compress(uVar7 + 1,out,im,&local_c510);
  gdPutC('\0',out);
  gdPutC(';',out);
  if (im_00 != (gdImagePtr)0x0) {
    gdImageDestroy(im_00);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifCtx(gdImagePtr im, gdIOCtxPtr out)
{
	gdImagePtr pim = 0, tim = im;
	int interlace, BitsPerPixel;
	interlace = im->interlace;

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
		acceptable result: mix down to a palette
		based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if(!pim) {
			return;
		}
		tim = pim;
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFEncode(
	    out, tim->sx, tim->sy, interlace, 0, tim->transparent, BitsPerPixel,
	    tim->red, tim->green, tim->blue, tim);

	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(	pim);
	}
}